

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_pbf_writer.hpp
# Opt level: O2

void __thiscall
protozero::basic_pbf_writer<std::__cxx11::string>::
add_packed_uint32<std::istream_iterator<unsigned_int,char,std::char_traits<char>,long>>
          (basic_pbf_writer<std::__cxx11::string> *this,pbf_tag_type tag,
          istream_iterator<unsigned_int,_char,_std::char_traits<char>,_long> *first,
          istream_iterator<unsigned_int,_char,_std::char_traits<char>,_long> *last)

{
  istream_iterator<unsigned_int,_char,_std::char_traits<char>,_long> local_20;
  istream_iterator<unsigned_int,_char,_std::char_traits<char>,_long> local_10;
  
  local_10._M_stream = first->_M_stream;
  local_10._M_value = first->_M_value;
  local_10._M_ok = first->_M_ok;
  local_20._M_stream = last->_M_stream;
  local_20._M_value = last->_M_value;
  local_20._M_ok = last->_M_ok;
  add_packed_varint<std::istream_iterator<unsigned_int,char,std::char_traits<char>,long>>
            (this,tag,&local_10,&local_20);
  return;
}

Assistant:

void add_packed_uint32(pbf_tag_type tag, InputIterator first, InputIterator last) { // NOLINT(performance-unnecessary-value-param)
        add_packed_varint(tag, first, last);
    }